

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void datetimeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  byte bVar1;
  ushort uVar5;
  short sVar6;
  uint uVar7;
  short sVar8;
  int iVar9;
  uint *z;
  undefined1 auVar10 [16];
  DateTime x;
  undefined1 local_58;
  uint local_57;
  undefined1 local_53;
  char local_52;
  char local_51;
  undefined1 local_50;
  char local_4f;
  char local_4e;
  undefined1 local_4d;
  char local_4c;
  char local_4b;
  undefined1 local_4a;
  char local_49;
  char local_48;
  undefined1 local_47;
  char local_46;
  char local_45;
  undefined1 local_44;
  DateTime local_40;
  byte bVar2;
  char cVar3;
  char cVar4;
  
  z = (uint *)&local_58;
  iVar9 = isDate(context,argc,argv,&local_40);
  if (iVar9 == 0) {
    computeYMD(&local_40);
    computeHMS(&local_40);
    uVar7 = -local_40.Y;
    if (0 < local_40.Y) {
      uVar7 = local_40.Y;
    }
    auVar10._0_4_ = (uVar7 / 1000) % 10;
    auVar10._4_4_ = (uVar7 / 100) % 10;
    auVar10._8_4_ = (uVar7 / 10) % 10;
    auVar10._12_4_ = uVar7 % 10;
    auVar10 = auVar10 & _DAT_001e3ec0;
    uVar5 = auVar10._0_2_;
    bVar1 = (uVar5 != 0) * (uVar5 < 0x100) * auVar10[0] - (0xff < uVar5);
    uVar5 = auVar10._4_2_;
    bVar2 = (uVar5 != 0) * (uVar5 < 0x100) * auVar10[4] - (0xff < uVar5);
    sVar6 = auVar10._8_2_;
    cVar3 = (0 < sVar6) * (sVar6 < 0x100) * auVar10[8] - (0xff < sVar6);
    sVar6 = auVar10._10_2_;
    sVar8 = CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar10[10] - (0xff < sVar6),cVar3);
    sVar6 = auVar10._12_2_;
    cVar4 = (0 < sVar6) * (sVar6 < 0x100) * auVar10[0xc] - (0xff < sVar6);
    sVar6 = auVar10._14_2_;
    sVar6 = (short)(CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar10[0xe] - (0xff < sVar6),
                             CONCAT12(cVar4,sVar8)) >> 0x10);
    local_57 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * cVar4 - (0xff < sVar6),
                        CONCAT12((0 < sVar8) * (sVar8 < 0x100) * cVar3 - (0xff < sVar8),
                                 CONCAT11((bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2),
                                          (bVar1 != 0) * (bVar1 < 0x100) * bVar1 - (0xff < bVar1))))
               | (uint)DAT_001e3ed0;
    local_53 = 0x2d;
    cVar4 = (char)(local_40.M / 10);
    local_52 = cVar4 + (char)((local_40.M / 10) / 10) * -10 + '0';
    local_51 = (char)local_40.M + cVar4 * -10 + '0';
    local_50 = 0x2d;
    cVar4 = (char)(local_40.D / 10);
    local_4f = cVar4 + (char)((local_40.D / 10) / 10) * -10 + '0';
    local_4e = (char)local_40.D + cVar4 * -10 + '0';
    local_4d = 0x20;
    cVar4 = (char)(local_40.h / 10);
    local_4c = cVar4 + (char)((local_40.h / 10) / 10) * -10 + '0';
    local_4b = (char)local_40.h + cVar4 * -10 + '0';
    local_4a = 0x3a;
    cVar4 = (char)(local_40.m / 10);
    local_49 = cVar4 + (char)((local_40.m / 10) / 10) * -10 + '0';
    local_48 = (char)local_40.m + cVar4 * -10 + '0';
    local_47 = 0x3a;
    iVar9 = (int)local_40.s / 10;
    cVar4 = (char)iVar9;
    local_46 = cVar4 + (char)(iVar9 / 10) * -10 + '0';
    local_45 = (char)(int)local_40.s + cVar4 * -10 + '0';
    local_44 = 0;
    if (local_40.Y < 0) {
      local_58 = 0x2d;
      iVar9 = 0x14;
    }
    else {
      z = &local_57;
      iVar9 = 0x13;
    }
    setResultStrOrError(context,(char *)z,iVar9,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  }
  return;
}

Assistant:

static void datetimeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    int Y, s;
    char zBuf[24];
    computeYMD_HMS(&x);
    Y = x.Y;
    if( Y<0 ) Y = -Y;
    zBuf[1] = '0' + (Y/1000)%10;
    zBuf[2] = '0' + (Y/100)%10;
    zBuf[3] = '0' + (Y/10)%10;
    zBuf[4] = '0' + (Y)%10;
    zBuf[5] = '-';
    zBuf[6] = '0' + (x.M/10)%10;
    zBuf[7] = '0' + (x.M)%10;
    zBuf[8] = '-';
    zBuf[9] = '0' + (x.D/10)%10;
    zBuf[10] = '0' + (x.D)%10;
    zBuf[11] = ' ';
    zBuf[12] = '0' + (x.h/10)%10;
    zBuf[13] = '0' + (x.h)%10;
    zBuf[14] = ':';
    zBuf[15] = '0' + (x.m/10)%10;
    zBuf[16] = '0' + (x.m)%10;
    zBuf[17] = ':';
    s = (int)x.s;
    zBuf[18] = '0' + (s/10)%10;
    zBuf[19] = '0' + (s)%10;
    zBuf[20] = 0;
    if( x.Y<0 ){
      zBuf[0] = '-';
      sqlite3_result_text(context, zBuf, 20, SQLITE_TRANSIENT);
    }else{
      sqlite3_result_text(context, &zBuf[1], 19, SQLITE_TRANSIENT);
    }
  }
}